

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O3

void idx2::CompressBufZstd(buffer *Input,bitstream *Output)

{
  int iVar1;
  long lVar2;
  size_t dstCapacity;
  size_t sVar3;
  int iVar4;
  long lVar5;
  i64 unaff_R13;
  buffer local_48;
  
  if (Input->Bytes != 0) {
    dstCapacity = ZSTD_compressBound(Input->Bytes);
    lVar2 = (Output->Stream).Bytes;
    lVar5 = lVar2;
    if ((long)(dstCapacity + 8) < lVar2) goto LAB_0018c478;
    do {
      unaff_R13 = (lVar5 * 3) / 2;
      lVar5 = unaff_R13 + 8;
    } while (unaff_R13 <= (long)dstCapacity);
    if (unaff_R13 + 8 <= lVar2) goto LAB_0018c478;
    unaff_R13 = unaff_R13 + 0x10;
    if (Mallocator()::Instance == '\0') goto LAB_0018c4af;
    while( true ) {
      local_48.Data = (byte *)0x0;
      local_48.Bytes = 0;
      local_48.Alloc = (allocator *)&Mallocator()::Instance;
      AllocBuf(&local_48,unaff_R13,(Output->Stream).Alloc);
      iVar1 = Output->BitPos + 7;
      iVar4 = Output->BitPos + 0xe;
      if (-1 < iVar1) {
        iVar4 = iVar1;
      }
      MemCopy(&Output->Stream,&local_48,
              (u64)(Output->BitPtr + ((long)(iVar4 >> 3) - (long)(Output->Stream).Data)));
      Output->BitPtr = local_48.Data + ((long)Output->BitPtr - (long)(Output->Stream).Data);
      DeallocBuf(&Output->Stream);
      (Output->Stream).Alloc = local_48.Alloc;
      (Output->Stream).Data = local_48.Data;
      (Output->Stream).Bytes = local_48.Bytes;
LAB_0018c478:
      sVar3 = ZSTD_compress((Output->Stream).Data,dstCapacity,Input->Data,Input->Bytes,1);
      if (sVar3 != 0) break;
      CompressBufZstd();
LAB_0018c4af:
      CompressBufZstd();
    }
    Output->BitPtr = (Output->Stream).Data + sVar3;
  }
  return;
}

Assistant:

void
CompressBufZstd(const buffer& Input, bitstream* Output)
{
  if (Size(Input) == 0)
    return;
  size_t const MaxDstSize = ZSTD_compressBound(Size(Input));
  GrowToAccomodate(Output, MaxDstSize - Size(*Output));
  size_t const CpresSize =
    ZSTD_compress(Output->Stream.Data, MaxDstSize, Input.Data, Size(Input), 1);
  if (CpresSize <= 0)
  {
    fprintf(stderr, "CompressBufZstd failed\n");
    exit(1);
  }
  Output->BitPtr = CpresSize + Output->Stream.Data;
}